

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_tec_surf_zone(REF_GRID ref_grid,FILE *file)

{
  REF_CELL pRVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  long lVar5;
  undefined8 uVar6;
  REF_INT RVar7;
  int iVar8;
  REF_NODE pRVar9;
  char *pcVar10;
  uint cell_id;
  long lVar11;
  REF_INT nnode;
  REF_INT nface;
  REF_DICT ref_dict;
  REF_INT *g2l;
  REF_INT *l2g;
  REF_INT nodes [27];
  uint local_e0;
  uint local_dc;
  REF_DICT local_d8;
  REF_INT *local_d0;
  REF_GRID local_c8;
  REF_NODE local_c0;
  REF_INT *local_b8;
  long local_b0;
  uint local_a8 [30];
  
  pRVar9 = ref_grid->node;
  uVar3 = ref_dict_create(&local_d8);
  if (uVar3 == 0) {
    pRVar1 = ref_grid->cell[3];
    local_c0 = pRVar9;
    if (0 < pRVar1->max) {
      RVar7 = 0;
      do {
        RVar4 = ref_cell_nodes(pRVar1,RVar7,(REF_INT *)local_a8);
        if ((RVar4 == 0) &&
           (uVar3 = ref_dict_store(local_d8,local_a8[pRVar1->node_per],-1), uVar3 != 0)) {
          pcVar10 = "mark tri";
          uVar6 = 0x19b;
          goto LAB_00115ad4;
        }
        RVar7 = RVar7 + 1;
      } while (RVar7 < pRVar1->max);
    }
    pRVar1 = ref_grid->cell[6];
    if (0 < pRVar1->max) {
      iVar8 = 0;
      do {
        RVar4 = ref_cell_nodes(pRVar1,iVar8,(REF_INT *)local_a8);
        if ((RVar4 == 0) &&
           (uVar3 = ref_dict_store(local_d8,local_a8[pRVar1->node_per],-1), uVar3 != 0)) {
          pcVar10 = "mark qua";
          uVar6 = 0x1a0;
          goto LAB_00115ad4;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < pRVar1->max);
    }
    if (local_d8->n < 1) {
LAB_00115ddd:
      uVar3 = ref_dict_free(local_d8);
      if (uVar3 == 0) {
        return 0;
      }
      pcVar10 = "free dict";
      uVar6 = 0x1ca;
    }
    else {
      cell_id = *local_d8->key;
      uVar3 = ref_grid_tri_qua_id_nodes
                        (ref_grid,cell_id,(REF_INT *)&local_e0,(REF_INT *)&local_dc,&local_d0,
                         &local_b8);
      if (uVar3 == 0) {
        lVar11 = 0;
        pRVar9 = local_c0;
        local_c8 = ref_grid;
        do {
          local_b0 = lVar11;
          fprintf((FILE *)file,
                  "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                  (ulong)cell_id,(ulong)local_e0,(ulong)local_dc,"point","fequadrilateral");
          if (0 < (int)local_e0) {
            lVar11 = 0;
            do {
              pRVar2 = pRVar9->real;
              lVar5 = (long)local_b8[lVar11];
              fprintf((FILE *)file," %.16e %.16e %.16e\n",pRVar2[lVar5 * 0xf],
                      pRVar2[lVar5 * 0xf + 1],pRVar2[lVar5 * 0xf + 2]);
              lVar11 = lVar11 + 1;
            } while (lVar11 < (int)local_e0);
          }
          pRVar1 = local_c8->cell[3];
          if (0 < pRVar1->max) {
            RVar7 = 0;
            do {
              RVar4 = ref_cell_nodes(pRVar1,RVar7,(REF_INT *)local_a8);
              if ((RVar4 == 0) && (cell_id == local_a8[pRVar1->node_per])) {
                local_a8[3] = local_a8[2];
                lVar11 = 0;
                do {
                  fprintf((FILE *)file," %d",(ulong)(local_d0[(int)local_a8[lVar11]] + 1));
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 4);
                fputc(10,(FILE *)file);
                pRVar9 = local_c0;
              }
              RVar7 = RVar7 + 1;
            } while (RVar7 < pRVar1->max);
          }
          pRVar1 = local_c8->cell[6];
          if (0 < pRVar1->max) {
            iVar8 = 0;
            do {
              RVar4 = ref_cell_nodes(pRVar1,iVar8,(REF_INT *)local_a8);
              if ((RVar4 == 0) && (cell_id == local_a8[pRVar1->node_per])) {
                lVar11 = 0;
                do {
                  fprintf((FILE *)file," %d",(ulong)(local_d0[(int)local_a8[lVar11]] + 1));
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 4);
                fputc(10,(FILE *)file);
                pRVar9 = local_c0;
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 < pRVar1->max);
          }
          if (local_b8 != (REF_INT *)0x0) {
            free(local_b8);
          }
          lVar11 = local_b0;
          if (local_d0 != (REF_INT *)0x0) {
            free(local_d0);
          }
          lVar11 = lVar11 + 1;
          if (local_d8->n <= lVar11) goto LAB_00115ddd;
          cell_id = local_d8->key[lVar11];
          uVar3 = ref_grid_tri_qua_id_nodes
                            (local_c8,cell_id,(REF_INT *)&local_e0,(REF_INT *)&local_dc,&local_d0,
                             &local_b8);
        } while (uVar3 == 0);
      }
      pcVar10 = "extract this boundary";
      uVar6 = 0x1a5;
    }
  }
  else {
    pcVar10 = "create dict";
    uVar6 = 0x196;
  }
LAB_00115ad4:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar6,
         "ref_export_tec_surf_zone",(ulong)uVar3,pcVar10);
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_export_tec_surf_zone(REF_GRID ref_grid,
                                                   FILE *file) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *g2l, *l2g;
  REF_INT nface;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnode;
  REF_DICT ref_dict;
  REF_INT boundary_tag, boundary_index;

  ref_node = ref_grid_node(ref_grid);

  RSS(ref_dict_create(&ref_dict), "create dict");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) RSS(
      ref_dict_store(ref_dict, nodes[ref_cell_id_index(ref_cell)], REF_EMPTY),
      "mark tri");

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) RSS(
      ref_dict_store(ref_dict, nodes[ref_cell_id_index(ref_cell)], REF_EMPTY),
      "mark qua");

  each_ref_dict_key(ref_dict, boundary_index, boundary_tag) {
    RSS(ref_grid_tri_qua_id_nodes(ref_grid, boundary_tag, &nnode, &nface, &g2l,
                                  &l2g),
        "extract this boundary");

    fprintf(file,
            "zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            boundary_tag, nnode, nface, "point", "fequadrilateral");

    for (node = 0; node < nnode; node++)
      fprintf(file, " %.16e %.16e %.16e\n",
              ref_node_xyz(ref_node, 0, l2g[node]),
              ref_node_xyz(ref_node, 1, l2g[node]),
              ref_node_xyz(ref_node, 2, l2g[node]));

    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (boundary_tag == nodes[ref_cell_id_index(ref_cell)]) {
        nodes[3] = nodes[2];
        for (node = 0; node < 4; node++) {
          fprintf(file, " %d", g2l[nodes[node]] + 1);
        }
        fprintf(file, "\n");
      }
    }

    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (boundary_tag == nodes[ref_cell_id_index(ref_cell)]) {
        for (node = 0; node < 4; node++)
          fprintf(file, " %d", g2l[nodes[node]] + 1);
        fprintf(file, "\n");
      }
    }

    ref_free(l2g);
    ref_free(g2l);
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}